

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode Curl_rand_hex(Curl_easy *data,uchar *rnd,size_t num)

{
  uchar local_b8 [8];
  uchar buffer [128];
  CURLcode result;
  size_t num_local;
  uchar *rnd_local;
  Curl_easy *data_local;
  
  if ((num >> 1 < 0x80) && ((num & 1) != 0)) {
    data_local._4_4_ = Curl_rand(data,local_b8,num - 1 >> 1);
    if (data_local._4_4_ == CURLE_OK) {
      Curl_hexencode(local_b8,num - 1 >> 1,rnd,num);
    }
  }
  else {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_rand_hex(struct Curl_easy *data, unsigned char *rnd,
                       size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  unsigned char buffer[128];
  DEBUGASSERT(num > 1);

#ifdef __clang_analyzer__
  /* This silences a scan-build warning about accessing this buffer with
     uninitialized memory. */
  memset(buffer, 0, sizeof(buffer));
#endif

  if((num/2 >= sizeof(buffer)) || !(num&1)) {
    /* make sure it fits in the local buffer and that it is an odd number! */
    DEBUGF(infof(data, "invalid buffer size with Curl_rand_hex"));
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  num--; /* save one for null-termination */

  result = Curl_rand(data, buffer, num/2);
  if(result)
    return result;

  Curl_hexencode(buffer, num/2, rnd, num + 1);
  return result;
}